

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf.c
# Opt level: O0

int HKDF_Expand(EVP_MD *evp_md,uchar *prk,size_t prk_len,uchar *info,size_t info_len,uchar *okm,
               size_t okm_len)

{
  int iVar1;
  uchar *in_RCX;
  int in_EDX;
  void *in_RSI;
  EVP_MD *in_RDI;
  size_t in_R8;
  long in_R9;
  ulong in_stack_00000008;
  uchar ctr;
  size_t copy_len;
  size_t n;
  size_t dig_len;
  size_t done_len;
  uchar prev [64];
  uint i;
  int sz;
  int ret;
  HMAC_CTX *hmac;
  EVP_MD *in_stack_ffffffffffffff38;
  uchar local_b9;
  size_t local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  uchar local_98 [76];
  uint local_4c;
  int local_48;
  int local_44;
  HMAC_CTX *local_40;
  long local_38;
  size_t local_30;
  uchar *local_28;
  int local_20;
  void *local_18;
  EVP_MD *local_10;
  int local_4;
  
  local_44 = 0;
  local_a0 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = in_EDX;
  local_48 = EVP_MD_get_size(in_stack_ffffffffffffff38);
  if (local_48 < 1) {
    local_4 = 0;
  }
  else {
    local_a8 = (ulong)local_48;
    local_b0 = in_stack_00000008 / local_a8;
    if (in_stack_00000008 % local_a8 != 0) {
      local_b0 = local_b0 + 1;
    }
    if ((local_b0 < 0x100) && (local_38 != 0)) {
      local_40 = (HMAC_CTX *)HMAC_CTX_new();
      if (local_40 == (HMAC_CTX *)0x0) {
        local_4 = 0;
      }
      else {
        iVar1 = HMAC_Init_ex(local_40,local_18,local_20,local_10,(ENGINE *)0x0);
        if (iVar1 != 0) {
          for (local_4c = 1; local_4c <= local_b0; local_4c = local_4c + 1) {
            local_b9 = (uchar)local_4c;
            if ((((1 < local_4c) &&
                 ((iVar1 = HMAC_Init_ex(local_40,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0),
                  iVar1 == 0 || (iVar1 = HMAC_Update(local_40,local_98,local_a8), iVar1 == 0)))) ||
                (iVar1 = HMAC_Update(local_40,local_28,local_30), iVar1 == 0)) ||
               ((iVar1 = HMAC_Update(local_40,&local_b9,1), iVar1 == 0 ||
                (iVar1 = HMAC_Final(local_40,local_98,(uint *)0x0), iVar1 == 0))))
            goto LAB_00325d39;
            local_b8 = local_a8;
            if (in_stack_00000008 < local_a0 + local_a8) {
              local_b8 = in_stack_00000008 - local_a0;
            }
            memcpy((void *)(local_38 + local_a0),local_98,local_b8);
            local_a0 = local_b8 + local_a0;
          }
          local_44 = 1;
        }
LAB_00325d39:
        OPENSSL_cleanse(local_98,0x40);
        HMAC_CTX_free((HMAC_CTX *)0x325d55);
        local_4 = local_44;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int HKDF_Expand(const EVP_MD *evp_md,
                       const unsigned char *prk, size_t prk_len,
                       const unsigned char *info, size_t info_len,
                       unsigned char *okm, size_t okm_len)
{
    HMAC_CTX *hmac;
    int ret = 0, sz;
    unsigned int i;
    unsigned char prev[EVP_MAX_MD_SIZE];
    size_t done_len = 0, dig_len, n;

    sz = EVP_MD_get_size(evp_md);
    if (sz <= 0)
        return 0;
    dig_len = (size_t)sz;

    /* calc: N = ceil(L/HashLen) */
    n = okm_len / dig_len;
    if (okm_len % dig_len)
        n++;

    if (n > 255 || okm == NULL)
        return 0;

    if ((hmac = HMAC_CTX_new()) == NULL)
        return 0;

    if (!HMAC_Init_ex(hmac, prk, prk_len, evp_md, NULL))
        goto err;

    for (i = 1; i <= n; i++) {
        size_t copy_len;
        const unsigned char ctr = i;

        /* calc: T(i) = HMAC-Hash(PRK, T(i - 1) | info | i) */
        if (i > 1) {
            if (!HMAC_Init_ex(hmac, NULL, 0, NULL, NULL))
                goto err;

            if (!HMAC_Update(hmac, prev, dig_len))
                goto err;
        }

        if (!HMAC_Update(hmac, info, info_len))
            goto err;

        if (!HMAC_Update(hmac, &ctr, 1))
            goto err;

        if (!HMAC_Final(hmac, prev, NULL))
            goto err;

        copy_len = (done_len + dig_len > okm_len) ?
                       okm_len - done_len :
                       dig_len;

        memcpy(okm + done_len, prev, copy_len);

        done_len += copy_len;
    }
    ret = 1;

 err:
    OPENSSL_cleanse(prev, sizeof(prev));
    HMAC_CTX_free(hmac);
    return ret;
}